

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall jsonnet::internal::anon_unknown_0::Interpreter::decodeUTF8(Interpreter *this)

{
  Stack *this_00;
  double dVar1;
  pointer pFVar2;
  HeapEntity *pHVar3;
  _func_int **pp_Var4;
  HeapEntity *context;
  uint uVar5;
  ostream *poVar6;
  RuntimeError *pRVar7;
  Value VVar8;
  string sStack_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  this_00 = &this->stack;
  pFVar2 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar3 = pFVar2[-1].val.v.h;
  uVar5 = pFVar2[-1].elementId;
  while( true ) {
    pp_Var4 = pHVar3[1]._vptr_HeapEntity;
    if ((ulong)(*(long *)&pHVar3[1].mark - (long)pp_Var4 >> 3) <= (ulong)uVar5) {
      decode_utf8((UString *)&ss,&pFVar2[-1].bytes);
      VVar8 = makeString(this,(UString *)&ss);
      (this->scratch).t = STRING;
      (this->scratch).v = VVar8._0_8_;
      std::__cxx11::u32string::~u32string((u32string *)&ss);
      return (AST *)0x0;
    }
    context = (HeapEntity *)pp_Var4[uVar5];
    if (context->field_0xa != '\x01') {
      Stack::newCall(this_00,&pFVar2[-1].location,context,*(HeapObject **)&context[5].mark,
                     *(uint *)&context[6]._vptr_HeapEntity,(BindingFrame *)&context[2].mark);
      return *(AST **)&context[6].mark;
    }
    if (*(int *)&context[1]._vptr_HeapEntity != 2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_1a8,"Element ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," of the provided array was not a number");
      pRVar7 = (RuntimeError *)__cxa_allocate_exception(0x38);
      pFVar2 = (this->stack).stack.
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::stringbuf::str();
      Stack::makeError(pRVar7,this_00,&pFVar2[-1].location,&sStack_1d8);
      __cxa_throw(pRVar7,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    dVar1 = *(double *)&context[1].mark;
    if ((((dVar1 < 0.0) || (255.0 < dVar1)) || (dVar1 != (double)(int)dVar1)) ||
       (NAN(dVar1) || NAN((double)(int)dVar1))) break;
    std::__cxx11::string::push_back((char)&pFVar2[-1].bytes);
    uVar5 = pFVar2[-1].elementId + 1;
    pFVar2[-1].elementId = uVar5;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar6 = std::operator<<(local_1a8,"Element ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6," of the provided array was not an integer in range [0,255]");
  pRVar7 = (RuntimeError *)__cxa_allocate_exception(0x38);
  pFVar2 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::stringbuf::str();
  Stack::makeError(pRVar7,this_00,&pFVar2[-1].location,&sStack_1d8);
  __cxa_throw(pRVar7,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *decodeUTF8(void)
    {
        Frame &f = stack.top();
        const auto& elements = static_cast<HeapArray*>(f.val.v.h)->elements;
        while (f.elementId < elements.size()) {
            auto *th = elements[f.elementId];
            if (th->filled) {
                auto b = th->content;
                if (b.t != Value::NUMBER) {
                    std::stringstream ss;
                    ss << "Element " << f.elementId << " of the provided array was not a number";
                    throw makeError(stack.top().location, ss.str());
                } else {
                    double d = b.v.d;
                    if (d < 0 || d > 255 || d != int(d)) {
                        std::stringstream ss;
                        ss << "Element " << f.elementId << " of the provided array was not an integer in range [0,255]";
                        throw makeError(stack.top().location, ss.str());
                    }
                    f.bytes.push_back(uint8_t(d));
                }
                f.elementId++;
            } else {
                stack.newCall(f.location, th, th->self, th->offset, th->upValues);
                return th->body;
            }
        }
        scratch = makeString(decode_utf8(f.bytes));
        return nullptr;
    }